

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O0

int Sat_ProofReduce(Vec_Set_t *vProof,void *pRoots,int hProofPivot)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  satset *__src;
  word *__dest;
  bool bVar3;
  satset *local_88;
  int local_74;
  int RetValue;
  abctime clk;
  int nSize;
  int hTemp;
  int k;
  int j;
  int i;
  satset *pPivot;
  satset *pFanin;
  satset *pNode;
  Vec_Ptr_t *vUsed;
  int fVerbose;
  Vec_Int_t *vRoots;
  int hProofPivot_local;
  void *pRoots_local;
  Vec_Set_t *vProof_local;
  
  Abc_Clock();
  iVar1 = Proof_MarkUsedRec(vProof,(Vec_Int_t *)pRoots);
  p = Vec_PtrAlloc(iVar1);
  Vec_SetShrinkS(vProof,2);
  for (k = 0; k <= vProof->iPage; k = k + 1) {
    hTemp = 2;
    while( true ) {
      iVar1 = Vec_SetLimit(vProof->pPages[k]);
      bVar3 = false;
      if (hTemp < iVar1) {
        pFanin = (satset *)(vProof->pPages[k] + hTemp);
        bVar3 = pFanin != (satset *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Vec_SetWordNum((*(uint *)pFanin >> 3) + 2);
      if (pFanin->Id != 0) {
        iVar2 = Vec_SetAppendS(vProof,(*(uint *)pFanin >> 3) + 2);
        pFanin->Id = iVar2;
        if (pFanin->Id < 1) {
          __assert_fail("pNode->Id > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                        ,0x19b,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
        }
        Vec_PtrPush(p,pFanin);
        nSize = 0;
        while( true ) {
          bVar3 = false;
          if (nSize < (int)(*(uint *)pFanin >> 3)) {
            if ((*(uint *)(&pFanin[1].field_0x0 + (long)nSize * 4) & 1) == 0) {
              local_88 = Proof_NodeRead(vProof,*(int *)(&pFanin[1].field_0x0 + (long)nSize * 4) >> 2
                                       );
            }
            else {
              local_88 = (satset *)0x0;
            }
            pPivot = local_88;
            bVar3 = true;
          }
          if (!bVar3) break;
          if ((*(uint *)(&pFanin[1].field_0x0 + (long)nSize * 4) & 1) == 0) {
            if (pPivot->Id < 1) {
              __assert_fail("pFanin->Id > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                            ,0x1a1,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
            }
            *(uint *)(&pFanin[1].field_0x0 + (long)nSize * 4) =
                 pPivot->Id << 2 | *(uint *)(&pFanin[1].field_0x0 + (long)nSize * 4) & 2;
          }
          nSize = nSize + 1;
        }
      }
      hTemp = iVar1 + hTemp;
    }
  }
  k = 1;
  while( true ) {
    iVar1 = Vec_IntSize((Vec_Int_t *)pRoots);
    bVar3 = false;
    if (k < iVar1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pRoots,k);
      pFanin = Proof_NodeRead(vProof,iVar1);
      bVar3 = pFanin != (satset *)0x0;
    }
    if (!bVar3) break;
    Vec_IntWriteEntry((Vec_Int_t *)pRoots,k,pFanin->Id);
    k = k + 1;
  }
  if ((0 < hProofPivot) && (iVar1 = Vec_SetHandCurrent(vProof), hProofPivot <= iVar1)) {
    _j = Proof_NodeRead(vProof,hProofPivot);
    local_74 = Vec_SetHandCurrentS(vProof);
    for (k = 0; iVar1 = Vec_PtrSize(p), k < iVar1; k = k + 1) {
      __src = (satset *)Vec_PtrEntry(p,k);
      iVar1 = __src->Id;
      __src->Id = 0;
      __dest = Vec_SetEntry(vProof,iVar1);
      iVar2 = Proof_NodeWordNum(*(uint *)__src >> 3);
      memmove(__dest,__src,(long)iVar2 << 3);
      if ((_j != (satset *)0x0) && (_j <= __src)) {
        _j = (satset *)0x0;
        local_74 = iVar1;
      }
    }
    iVar1 = Vec_PtrSize(p);
    Vec_SetWriteEntryNum(vProof,iVar1);
    Vec_PtrFree(p);
    iVar1 = Vec_SetHandCurrentS(vProof);
    Vec_SetShrink(vProof,iVar1);
    Vec_SetShrinkLimits(vProof);
    return local_74;
  }
  __assert_fail("hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                ,0x1ab,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
}

Assistant:

int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot )
{
//    Vec_Set_t * vProof   = (Vec_Set_t *)&s->Proofs;
//    Vec_Int_t * vRoots   = (Vec_Int_t *)&s->claProofs;
    Vec_Int_t * vRoots   = (Vec_Int_t *)pRoots;
//    Vec_Int_t * vClauses = (Vec_Int_t *)&s->clauses;
    int fVerbose = 0;
    Vec_Ptr_t * vUsed;
    satset * pNode, * pFanin, * pPivot;
    int i, j, k, hTemp, nSize;
    abctime clk = Abc_Clock();
    static abctime TimeTotal = 0;
    int RetValue;
//Sat_ProofCheck0( vProof );

    // collect visited nodes
    nSize = Proof_MarkUsedRec( vProof, vRoots );
    vUsed = Vec_PtrAlloc( nSize );
//Sat_ProofCheck0( vProof );

    // relabel nodes to use smaller space
    Vec_SetShrinkS( vProof, 2 );
    Vec_SetForEachEntry( satset *, vProof, nSize, pNode, i, j )
    {
        nSize = Vec_SetWordNum( 2 + pNode->nEnts );
        if ( pNode->Id == 0 ) 
            continue;
        pNode->Id = Vec_SetAppendS( vProof, 2 + pNode->nEnts );
        assert( pNode->Id > 0 );
        Vec_PtrPush( vUsed, pNode );
        // update fanins
        Proof_NodeForeachFanin( vProof, pNode, pFanin, k )
            if ( (pNode->pEnts[k] & 1) == 0 ) // proof node
            {
                assert( pFanin->Id > 0 );
                pNode->pEnts[k] = (pFanin->Id << 2) | (pNode->pEnts[k] & 2);
            }
//            else // problem clause
//                assert( (int*)pFanin >= Vec_IntArray(vClauses) && (int*)pFanin < Vec_IntArray(vClauses)+Vec_IntSize(vClauses) );
    }
    // update roots
    Proof_ForeachNodeVec1( vRoots, vProof, pNode, i )
        Vec_IntWriteEntry( vRoots, i, pNode->Id );
    // determine new pivot
    assert( hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof) );
    pPivot = Proof_NodeRead( vProof, hProofPivot );
    RetValue = Vec_SetHandCurrentS(vProof);
    // compact the nodes
    Vec_PtrForEachEntry( satset *, vUsed, pNode, i )
    {
        hTemp = pNode->Id; pNode->Id = 0;
        memmove( Vec_SetEntry(vProof, hTemp), pNode, sizeof(word)*Proof_NodeWordNum(pNode->nEnts) );
        if ( pPivot && pPivot <= pNode )
        {
            RetValue = hTemp;
            pPivot = NULL;
        }
    }
    Vec_SetWriteEntryNum( vProof, Vec_PtrSize(vUsed) );
    Vec_PtrFree( vUsed );

    // report the result
    if ( fVerbose )
    {
        printf( "\n" );
        printf( "The proof was reduced from %6.2f MB to %6.2f MB (by %6.2f %%)  ", 
            1.0 * Vec_SetMemory(vProof) / (1<<20), 1.0 * Vec_SetMemoryS(vProof) / (1<<20), 
            100.0 * (Vec_SetMemory(vProof) - Vec_SetMemoryS(vProof)) / Vec_SetMemory(vProof) );
        TimeTotal += Abc_Clock() - clk;
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
    Vec_SetShrink( vProof, Vec_SetHandCurrentS(vProof) );
    Vec_SetShrinkLimits( vProof );
//    Sat_ProofReduceCheck( s );
//Sat_ProofCheck0( vProof );

    return RetValue;
}